

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrixFunction.cpp
# Opt level: O0

void getR(int itAtom,double *a,double theta,double (*R) [4])

{
  int iVar1;
  double local_278;
  double tmp [4] [4];
  int local_1ec;
  int p;
  double transposeT [4] [4];
  double T [4] [4];
  int local_e0;
  int local_dc;
  int j;
  int i;
  double Q [4] [4];
  int k;
  int jj;
  int ii;
  double v [3];
  double (*R_local) [4];
  double theta_local;
  double *a_local;
  int itAtom_local;
  
  for (Q[3][3]._4_4_ = 0; Q[3][3]._4_4_ < 3; Q[3][3]._4_4_ = Q[3][3]._4_4_ + 1) {
    *(double *)(&jj + (long)Q[3][3]._4_4_ * 2) =
         a[(itAtom + -2) * 3 + Q[3][3]._4_4_] - a[(itAtom + -1) * 3 + Q[3][3]._4_4_];
  }
  unitization((double *)&jj);
  initialize_0((double (*) [4])&j);
  getQ((double (*) [4])&j,(double *)&jj,theta);
  for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
    for (local_e0 = 0; local_e0 < 4; local_e0 = local_e0 + 1) {
      if ((local_dc == 3) || (local_e0 == 3)) {
        (&j + (long)local_dc * 8 + (long)local_e0 * 2)[0] = 0;
        (&j + (long)local_dc * 8 + (long)local_e0 * 2)[1] = 0;
      }
    }
  }
  Q[3][2] = 1.0;
  initialize_1((double (*) [4])(transposeT[3] + 3));
  initialize_1((double (*) [4])&stack0xfffffffffffffe18);
  iVar1 = (itAtom + -1) * 3;
  for (local_1ec = 0; local_1ec < 3; local_1ec = local_1ec + 1) {
    T[local_1ec][2] = a[iVar1 + local_1ec];
    transposeT[local_1ec][2] = -a[iVar1 + local_1ec];
  }
  matrixProduct((double (*) [4])(transposeT[3] + 3),(double (*) [4])&j,(double (*) [4])&local_278);
  matrixProduct((double (*) [4])&local_278,(double (*) [4])&stack0xfffffffffffffe18,R);
  return;
}

Assistant:

void getR(int itAtom, double * a, double theta, double R[4][4]){
    double v[3];
    int ii=(itAtom-2) *3, jj=(itAtom-1) *3;       // i: the x index of (itAtom-2)
    for (int k=0; k<3; k++)
        v[k] = a[ii+k] - a[jj+k];                             // v = Q(i-1) - Qi
    unitization(v);                                         // v[0]^2 + v[1]^2 + v[2]^2 = 1
    double Q[4][4];
    initialize_0(Q);
    getQ(Q, v, theta);          //set Q[3][3]
    for (int i=0; i<4; i++)
        for (int j=0; j<4; j++)
            if (i==3 || j==3)
                Q[i][j] = 0;
    Q[3][3] = 1;

    double T[4][4], transposeT[4][4];
    initialize_1(T);
    initialize_1(transposeT);
    jj=(itAtom-1) *3;
    for (int p=0; p<3; p++){
        T[p][3] = a[jj+p];
        transposeT[p][3] = -a[jj+p];
    }
    double tmp[4][4];
    matrixProduct(T, Q, tmp);
    matrixProduct(tmp, transposeT, R);
}